

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

bool convertMetaObject(QMetaType fromType,void *from,QMetaType toType,void *to)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QMetaObject *pQVar4;
  QMetaObject *pQVar5;
  undefined4 extraout_var;
  QObject *pQVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QMetaType local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  uVar7 = 0;
  local_30.d_ptr = toType.d_ptr;
  if (fromType.d_ptr == (QMetaTypeInterface *)0x0) {
LAB_0026f49b:
    if (toType.d_ptr != (QMetaTypeInterface *)0x0) {
      uVar2 = (toType.d_ptr)->flags & 0x800;
    }
    if (uVar7 == uVar2) {
      if ((fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
         ((fromType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
        pQVar4 = (QMetaObject *)0x0;
      }
      else {
        pQVar4 = (*(fromType.d_ptr)->metaObjectFn)(fromType.d_ptr);
      }
      if ((toType.d_ptr != (QMetaTypeInterface *)0x0) &&
         ((toType.d_ptr)->metaObjectFn != (MetaObjectFn)0x0)) {
        pQVar5 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
        if (pQVar5 != (QMetaObject *)0x0 && pQVar4 != (QMetaObject *)0x0) {
          bVar1 = QMetaObject::inherits(pQVar4,pQVar5);
          if (bVar1) {
            QMetaType::destruct(&local_30,to);
            QMetaType::construct(&local_30,to,from);
            goto LAB_0026f5a4;
          }
        }
      }
    }
LAB_0026f5a8:
    bVar1 = false;
  }
  else {
    if ((toType.d_ptr == (QMetaTypeInterface *)0x0 || ((fromType.d_ptr)->flags & 8) == 0) ||
       (((toType.d_ptr)->flags & 8) == 0)) {
      uVar7 = (fromType.d_ptr)->flags & 0x800;
      goto LAB_0026f49b;
    }
    pQVar6 = *from;
    if (pQVar6 == (QObject *)0x0) {
      if ((fromType.d_ptr)->metaObjectFn != (MetaObjectFn)0x0) {
        pQVar4 = (*(fromType.d_ptr)->metaObjectFn)(fromType.d_ptr);
        if (pQVar4 != (QMetaObject *)0x0) {
          *(undefined8 *)to = 0;
          if ((fromType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0) {
            pQVar4 = (QMetaObject *)0x0;
          }
          else {
            pQVar4 = (*(fromType.d_ptr)->metaObjectFn)(fromType.d_ptr);
          }
          if ((toType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0) {
            pQVar5 = (QMetaObject *)0x0;
          }
          else {
            pQVar5 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            bVar1 = QMetaObject::inherits(pQVar4,pQVar5);
            return bVar1;
          }
          goto LAB_0026f600;
        }
      }
      goto LAB_0026f5a8;
    }
    iVar3 = (**pQVar6->_vptr_QObject)(pQVar6);
    if ((toType.d_ptr)->metaObjectFn == (MetaObjectFn)0x0) {
      pQVar4 = (QMetaObject *)0x0;
    }
    else {
      pQVar4 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
    }
    bVar1 = QMetaObject::inherits((QMetaObject *)CONCAT44(extraout_var,iVar3),pQVar4);
    if (!bVar1) goto LAB_0026f5a8;
    pQVar4 = (*(toType.d_ptr)->metaObjectFn)(toType.d_ptr);
    pQVar6 = QMetaObject::cast(pQVar4,pQVar6);
    *(QObject **)to = pQVar6;
LAB_0026f5a4:
    bVar1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
LAB_0026f600:
  __stack_chk_fail();
}

Assistant:

static bool convertMetaObject(QMetaType fromType, const void *from, QMetaType toType, void *to)
{
    // handle QObject conversion
    if ((fromType.flags() & QMetaType::PointerToQObject) && (toType.flags() & QMetaType::PointerToQObject)) {
        QObject *fromObject = *static_cast<QObject * const *>(from);
        // use dynamic metatype of from if possible
        if (fromObject && fromObject->metaObject()->inherits(toType.metaObject()))  {
            *static_cast<QObject **>(to) = toType.metaObject()->cast(fromObject);
            return true;
        } else if (!fromObject && fromType.metaObject()) {
            // if fromObject is null, use static fromType to check if conversion works
            *static_cast<void **>(to) = nullptr;
            return fromType.metaObject()->inherits(toType.metaObject());
        }
    } else if ((fromType.flags() & QMetaType::IsPointer) == (toType.flags() & QMetaType::IsPointer)) {
        // fromType and toType are of same 'pointedness'
        const QMetaObject *f = fromType.metaObject();
        const QMetaObject *t = toType.metaObject();
        if (f && t && f->inherits(t)) {
            toType.destruct(to);
            toType.construct(to, from);
            return true;
        }
    }
    return false;
}